

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack1to8.h
# Opt level: O1

void ncnn::conv1x1s2_sgemm_pack1to8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  uint _c;
  int _w;
  int _h;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  _func_int ***ppp_Var8;
  undefined4 *puVar9;
  int iVar10;
  Mat local_98;
  Mat *local_48;
  Mat *local_40;
  Option *local_38;
  
  iVar1 = bottom_blob->w;
  _c = bottom_blob->c;
  _w = top_blob->w;
  _h = top_blob->h;
  local_98.cstep = 0;
  local_98.data = (Allocator *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elempack = 0;
  local_98._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_98.elemsize._4_4_ = (int)local_98.refcount;
  local_98.allocator = (Allocator *)local_98.data;
  local_98.dims = (int)local_98.refcount;
  local_98.w = local_98.refcount._4_4_;
  local_98.c = local_98.elempack;
  local_48 = kernel;
  local_40 = _bias;
  local_38 = opt;
  Mat::create(&local_98,_w,_h,_c,bottom_blob->elemsize,bottom_blob->elempack,
              opt->workspace_allocator);
  if (0 < (int)_c) {
    pvVar2 = bottom_blob->data;
    sVar3 = bottom_blob->cstep;
    sVar4 = bottom_blob->elemsize;
    uVar7 = 0;
    do {
      if (0 < _h) {
        ppp_Var8 = (_func_int ***)
                   ((long)(_func_int ***)local_98.data +
                   local_98.cstep * CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize)
                   * uVar7);
        puVar9 = (undefined4 *)(sVar3 * sVar4 * uVar7 + (long)pvVar2);
        iVar10 = 0;
        do {
          iVar6 = _w;
          if (0 < _w) {
            do {
              *(undefined4 *)ppp_Var8 = *puVar9;
              puVar9 = puVar9 + 2;
              ppp_Var8 = (_func_int ***)((long)ppp_Var8 + 4);
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          puVar9 = puVar9 + (iVar1 - _w) * 2;
          iVar10 = iVar10 + 1;
        } while (iVar10 != _h);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != _c);
  }
  conv1x1s1_sgemm_pack1to8_avx(&local_98,top_blob,local_48,local_40,local_38);
  piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,(int)local_98.refcount);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_98.data != (Allocator *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s2_sgemm_pack1to8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = w - 2 * outw + w;

    Mat bottom_blob_shrinked;
    bottom_blob_shrinked.create(outw, outh, channels, elemsize, elempack, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const float* r0 = bottom_blob.channel(p);
        float* outptr = bottom_blob_shrinked.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                outptr[0] = r0[0];

                r0 += 2;
                outptr += 1;
            }

            r0 += tailstep;
        }
    }

    conv1x1s1_sgemm_pack1to8_avx(bottom_blob_shrinked, top_blob, kernel, _bias, opt);
}